

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_delete_empty(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  char local_54;
  int iStack_50;
  ion_status_t status;
  int key;
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)&status.count);
  status.error = '\x03';
  status._1_3_ = 0;
  iVar2 = sl_delete((ion_skiplist_t *)&status.count,&status);
  local_54 = iVar2.error;
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(local_54 == '\x01'),0x357,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iStack_50 = iVar2.count;
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iStack_50 == 0),0x358,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  sl_destroy((ion_skiplist_t *)&status.count);
  return;
}

Assistant:

void
test_skiplist_delete_empty(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	int				key		= 3;
	ion_status_t	status	= sl_delete(&skiplist, (ion_key_t) &key);

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	sl_destroy(&skiplist);
}